

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_output(lyout *out,lys_node *node,int *first)

{
  lys_module *plVar1;
  lys_node_inout *output;
  int *first_local;
  lys_node *node_local;
  lyout *out_local;
  
  plVar1 = lys_main_module(node->module);
  jsons_print_object(out,"output","module",plVar1->name,0,first);
  jsons_print_typedefs
            (out,*(lys_tpdf **)node->hash,(uint8_t)*(undefined2 *)(node->padding + 2),(int *)0x0);
  jsons_print_musts(out,(lys_restr *)node[1].name,node->padding[1],(int *)0x0);
  jsons_print_groupings(out,node->child,(int *)0x0);
  jsons_print_data(out,node->module,node->child,(int *)0x0);
  ly_print(out,"}");
  return;
}

Assistant:

static void
jsons_print_output(struct lyout *out, const struct lys_node *node, int *first)
{
    struct lys_node_inout *output = (struct lys_node_inout *)node;

    jsons_print_object(out, "output", "module", lys_main_module(node->module)->name, 0, first);
    jsons_print_typedefs(out, output->tpdf, output->tpdf_size, NULL);
    jsons_print_musts(out, output->must, output->must_size, NULL);
    jsons_print_groupings(out, output->child, NULL);
    jsons_print_data(out, output->module, output->child, NULL);
    ly_print(out, "}");
}